

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

void __thiscall pbrt::SquareMatrix<4>::SquareMatrix(SquareMatrix<4> *this,span<const_float> t)

{
  int i;
  ulong uVar1;
  int va;
  size_t vb;
  
  vb = t.n;
  va = 0x10;
  if (vb == 0x10) {
    for (uVar1 = 0; uVar1 != 0x10; uVar1 = uVar1 + 1) {
      this->m[uVar1 >> 2 & 0x3fffffff][(uint)uVar1 & 3] = t.ptr[uVar1];
    }
    return;
  }
  LogFatal<char_const(&)[6],char_const(&)[9],char_const(&)[6],int&,char_const(&)[9],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math.h"
             ,0x569,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [6])"N * N",
             (char (*) [9])"t.size()",(char (*) [6])"N * N",&va,(char (*) [9])"t.size()",&vb);
}

Assistant:

PBRT_CPU_GPU inline SquareMatrix<N>::SquareMatrix(pstd::span<const Float> t) {
    CHECK_EQ(N * N, t.size());
    for (int i = 0; i < N * N; ++i)
        m[i / N][i % N] = t[i];
}